

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

void __thiscall lsim::Simulator::run_until_stable(Simulator *this,size_t stable_ticks)

{
  pointer puVar1;
  unsigned_long uVar2;
  bool bVar3;
  pointer puVar4;
  bool bVar5;
  pointer puVar6;
  long lVar7;
  size_t sVar8;
  
  bVar5 = false;
  sVar8 = stable_ticks;
  do {
    step(this);
    puVar4 = (this->m_node_change_time).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (this->m_node_change_time).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar7 = (long)puVar1 - (long)puVar4 >> 5;
    puVar6 = puVar4;
    if (0 < lVar7) {
      uVar2 = this->m_time;
      puVar6 = (pointer)(((long)puVar1 - (long)puVar4 & 0xffffffffffffffe0U) + (long)puVar4);
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 2;
      do {
        if (uVar2 == puVar4[-2]) {
          puVar4 = puVar4 + -2;
          goto LAB_0017e71d;
        }
        if (uVar2 == puVar4[-1]) {
          puVar4 = puVar4 + -1;
          goto LAB_0017e71d;
        }
        if (uVar2 == *puVar4) goto LAB_0017e71d;
        if (uVar2 == puVar4[1]) {
          puVar4 = puVar4 + 1;
          goto LAB_0017e71d;
        }
        lVar7 = lVar7 + -1;
        puVar4 = puVar4 + 4;
      } while (1 < lVar7);
    }
    lVar7 = (long)puVar1 - (long)puVar6 >> 3;
    if (lVar7 == 1) {
LAB_0017e6fe:
      puVar4 = puVar6;
      if (this->m_time != *puVar6) {
        puVar4 = puVar1;
      }
    }
    else if (lVar7 == 2) {
LAB_0017e6f2:
      puVar4 = puVar6;
      if (this->m_time != *puVar6) {
        puVar6 = puVar6 + 1;
        goto LAB_0017e6fe;
      }
    }
    else {
      puVar4 = puVar1;
      if ((lVar7 == 3) && (puVar4 = puVar6, this->m_time != *puVar6)) {
        puVar6 = puVar6 + 1;
        goto LAB_0017e6f2;
      }
    }
LAB_0017e71d:
    sVar8 = sVar8 - 1;
    bVar3 = sVar8 == 0;
    if (puVar4 != puVar1) {
      sVar8 = stable_ticks;
      bVar3 = bVar5;
    }
    bVar5 = bVar3;
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void Simulator::run_until_stable(size_t stable_ticks) {
    bool stop = false;
    auto remaining = stable_ticks;

    while (!stop) {
        step();

        bool stable = std::none_of(std::begin(m_node_change_time), std::end(m_node_change_time), 
                            [=] (auto t) {return t == m_time;}
        );

        if (!stable) {
            remaining = stable_ticks;
        } else {
            stop = --remaining == 0;
        }
    }
}